

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtobj.cpp
# Opt level: O0

void __thiscall
CVmObjTads::set_prop
          (CVmObjTads *this,CVmUndo *undo,vm_obj_id_t self,vm_prop_id_t prop,vm_val_t *val)

{
  int iVar1;
  vm_tadsobj_hdr *pvVar2;
  CVmUndo *this_00;
  long in_RSI;
  vm_tadsobj_hdr *in_RDI;
  vm_tadsobj_hdr *in_R8;
  vm_val_t oldval;
  vm_tadsobj_prop *entry;
  vm_tadsobj_hdr *hdr;
  vm_val_t *in_stack_ffffffffffffffc0;
  anon_union_8_8_cb74652f_for_val in_stack_ffffffffffffffc8;
  undefined4 uVar4;
  anon_union_8_8_cb74652f_for_val aVar3;
  
  pvVar2 = get_hdr((CVmObjTads *)in_RDI);
  this_00 = (CVmUndo *)
            vm_tadsobj_hdr::find_prop_entry
                      ((vm_tadsobj_hdr *)in_stack_ffffffffffffffc8.native_desc,
                       (uint)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
  uVar4 = in_stack_ffffffffffffffc8._4_4_;
  if (this_00 == (CVmUndo *)0x0) {
    iVar1 = vm_tadsobj_hdr::has_free_entries(pvVar2,1);
    if (iVar1 == 0) {
      pvVar2 = vm_tadsobj_hdr::expand((CVmObjTads *)in_stack_ffffffffffffffc0,in_RDI);
      *(vm_tadsobj_hdr **)&in_RDI->li_obj_flags = pvVar2;
      pvVar2 = get_hdr((CVmObjTads *)in_RDI);
    }
    this_00 = (CVmUndo *)
              vm_tadsobj_hdr::alloc_prop_entry
                        (in_R8,(vm_prop_id_t)((ulong)pvVar2 >> 0x30),(vm_val_t *)this_00,uVar4);
    vm_val_t::set_empty((vm_val_t *)&stack0xffffffffffffffc0);
    aVar3.ptr = (void *)((ulong)(uint)uVar4 << 0x20);
  }
  else {
    in_stack_ffffffffffffffc0 = *(vm_val_t **)&this_00->oldest_first_;
    aVar3 = *(anon_union_8_8_cb74652f_for_val *)
             &((anon_union_8_8_cb74652f_for_val *)&this_00->next_free_)->obj;
    *(tadsobj_objid_and_ptr **)&this_00->oldest_first_ = in_R8->inh_path;
    *(anon_union_8_8_cb74652f_for_val *)&this_00->next_free_ =
         *(anon_union_8_8_cb74652f_for_val *)&in_R8->li_obj_flags;
  }
  if ((in_RSI != 0) && (((ulong)this_00->cur_first_ & 2) == 0)) {
    CVmUndo::add_new_record_prop_key(this_00,aVar3._4_4_,aVar3._2_2_,in_stack_ffffffffffffffc0);
    uVar4 = aVar3._4_4_;
    *(byte *)&this_00->cur_first_ = *(byte *)&this_00->cur_first_ | 2;
    if ((((ulong)this_00->cur_first_ & 1) == 0) &&
       ((vm_datatype_t)in_stack_ffffffffffffffc0 != VM_EMPTY)) {
      vm_val_t::set_empty((vm_val_t *)&stack0xffffffffffffffc0);
      CVmUndo::add_new_record_prop_key(this_00,uVar4,0,in_stack_ffffffffffffffc0);
    }
  }
  *(byte *)&this_00->cur_first_ = *(byte *)&this_00->cur_first_ | 1;
  mark_modified((CVmObjTads *)in_R8,(CVmUndo *)pvVar2,(vm_obj_id_t)((ulong)this_00 >> 0x20));
  return;
}

Assistant:

void CVmObjTads::set_prop(VMG_ CVmUndo *undo, vm_obj_id_t self,
                          vm_prop_id_t prop, const vm_val_t *val)
{
    /* get my header */
    vm_tadsobj_hdr *hdr = get_hdr();

    /* look for an existing property entry */
    vm_tadsobj_prop *entry = hdr->find_prop_entry(prop);

    /* check for an existing entry for the property */
    vm_val_t oldval;
    if (entry != 0)
    {
        /* found an existing entry - note the old value */
        oldval = entry->val;

        /* store the new value in the existing entry */
        entry->val = *val;
    }
    else
    {
        /* 
         *   We didn't find an existing entry for the property, so we have to
         *   add a new one.  If we don't have any free property slots left,
         *   expand the object to create some more property slots.  
         */
        if (!hdr->has_free_entries(1))
        {
            /* expand the extension to make room for more properties */
            ext_ = (char *)vm_tadsobj_hdr::expand(vmg_ this, hdr);

            /* get the reallocated header */
            hdr = get_hdr();
        }

        /* allocate a new entry */
        entry = hdr->alloc_prop_entry(prop, val, 0);

        /* 
         *   The old value didn't exist, so mark it emtpy, with an intval of
         *   zero.  The zero indicates that this is a newly created property
         *   entry, and thus should be deleted on undo.  
         */
        oldval.set_empty();
        oldval.val.intval = 0;
    }

    /*
     *   If we already have undo for this property for the current
     *   savepoint, as indicated by the undo flag for the property, we don't
     *   need to save undo for this change, since we already have an undo
     *   record in the current savepoint.  Otherwise, we need to add an undo
     *   record for this savepoint.  
     */
    if (undo != 0 && (entry->flags & VMTO_PROP_UNDO) == 0)
    {
        /* save the undo record */
        undo->add_new_record_prop_key(vmg_ self, prop, &oldval);

        /* mark the property as now having undo in this savepoint */
        entry->flags |= VMTO_PROP_UNDO;

        /* 
         *   If the entry wasn't previously marked as modified, remember this
         *   by storing an extra 'empty' undo record with intval 1 after the
         *   record we just saved.  When we see an 'empty' undo value with an
         *   intval of 1, we recognize it as this special marker that tells
         *   us to remove the 'modified' flag from the property.  Note that
         *   we don't need to bother if the old value was already empty,
         *   since that deletes the whole property on undo, making the
         *   'modified' flag irrelevant.  
         */
        if ((entry->flags & VMTO_PROP_MOD) == 0 && oldval.typ != VM_EMPTY)
        {
            /* store an empty undo record with intval 1 */
            oldval.set_empty();
            oldval.val.intval = 1;
            undo->add_new_record_prop_key(vmg_ self, prop, &oldval);
        }
    }

    /* mark the property entry as modified */
    entry->flags |= VMTO_PROP_MOD;

    /* mark the overall object as modified */
    mark_modified(vmg_ undo, self);
}